

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

void __thiscall tonk::RefCounter::StartShutdown(RefCounter *this,uint reason,Result *result)

{
  string local_40;
  
  std::mutex::lock(&this->ShutdownLock);
  if (((this->Shutdown)._M_base._M_i & 1U) == 0) {
    this->ShutdownReason = reason;
    Result::ToJson_abi_cxx11_(&local_40,result);
    std::__cxx11::string::operator=((string *)&this->ShutdownJson,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    LOCK();
    (this->Shutdown)._M_base._M_i = true;
    UNLOCK();
    LOCK();
    (this->RefCount).super___atomic_base<int>._M_i =
         (this->RefCount).super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->ShutdownLock);
  return;
}

Assistant:

void RefCounter::StartShutdown(unsigned reason, const Result& result)
{
    std::lock_guard<std::mutex> locker(ShutdownLock);

    if (Shutdown) {
        return;
    }

    ShutdownReason = reason;
    ShutdownJson = result.ToJson();

    Shutdown = true;

    // Remove self reference
    DecrementReferences();
}